

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_val(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  double number;
  Value local_88;
  Value local_78;
  undefined4 local_64;
  Value local_60 [2];
  String local_40;
  ValueType local_30;
  Value val;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  val.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  if (local_30 == Number) {
    Value::Value(local_60,(Value *)&stack0xffffffffffffffd0);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,local_60,true);
    Value::~Value(local_60);
  }
  else if (local_30 == String) {
    Value::GetString(&local_88);
    number = String::DoubleValue((String *)&local_88,"%lf");
    Value::Value(&local_78,number);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_78,true);
    Value::~Value(&local_78);
    String::~String((String *)&local_88);
  }
  else {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
  }
  local_64 = 1;
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_val(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::Number) return IntrinsicResult(val);
		if (val.type == ValueType::String) return IntrinsicResult(val.GetString().DoubleValue());
		return IntrinsicResult::Null;
	}